

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O2

int Imf_3_4::levelSize(int min,int max,int l,LevelRoundingMode rmode)

{
  int iVar1;
  ArgExc *this;
  
  if (-1 < l) {
    iVar1 = ((max - min) + 1) / (1 << ((byte)l & 0x1f));
    iVar1 = iVar1 + (uint)(iVar1 << ((byte)l & 0x1f) <= max - min && rmode == ROUND_UP);
    if (iVar1 < 2) {
      iVar1 = 1;
    }
    return iVar1;
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this,"Argument not in valid range.");
  __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

int
levelSize (int min, int max, int l, LevelRoundingMode rmode)
{
    if (l < 0) throw IEX_NAMESPACE::ArgExc ("Argument not in valid range.");

    int a    = max - min + 1;
    int b    = (1 << l);
    int size = a / b;

    if (rmode == ROUND_UP && size * b < a) size += 1;

    return std::max (size, 1);
}